

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

int itf8_encode(cram_fd *fd,int32_t val)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  ssize_t sVar4;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  byte local_19;
  int len;
  undefined1 auStack_14 [3];
  char buf [5];
  int32_t val_local;
  cram_fd *fd_local;
  
  bVar2 = (byte)val;
  if ((val & 0xffffff80U) == 0) {
    local_24 = 1;
    local_19 = bVar2;
  }
  else {
    bVar1 = (byte)((uint)val >> 8);
    if ((val & 0xffffc000U) == 0) {
      local_19 = bVar1 | 0x80;
      local_28 = 2;
      len._0_1_ = bVar2;
    }
    else {
      len._0_1_ = (byte)((uint)val >> 0x10);
      if ((val & 0xffe00000U) == 0) {
        local_19 = (byte)len | 0xc0;
        local_2c = 3;
        len._0_1_ = bVar1;
        len._1_1_ = bVar2;
      }
      else {
        local_19 = (byte)((uint)val >> 0x18);
        if ((val & 0xf0000000U) == 0) {
          local_19 = local_19 | 0xe0;
          local_30 = 4;
          len._1_1_ = bVar1;
          len._2_1_ = bVar2;
        }
        else {
          local_19 = (char)local_19 >> 4 | 0xf0;
          len._0_1_ = (byte)(val >> 0x14);
          len._1_1_ = (byte)(val >> 0xc);
          len._2_1_ = (byte)(val >> 4);
          len._3_1_ = bVar2 & 0xf;
          local_30 = 5;
        }
        local_2c = local_30;
      }
      local_28 = local_2c;
    }
    local_24 = local_28;
  }
  _auStack_14 = val;
  unique0x10000073 = fd;
  sVar4 = hwrite(fd->fp,&local_19,(long)local_24);
  iVar3 = -1;
  if (sVar4 == local_24) {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int itf8_encode(cram_fd *fd, int32_t val) {
    char buf[5];
    int len = itf8_put(buf, val);
    return hwrite(fd->fp, buf, len) == len ? 0 : -1;
}